

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2melody.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *filename;
  ostream *poVar3;
  allocator local_99;
  vector<Melody,_std::allocator<Melody>_> melody;
  MidiFile midifile;
  
  checkOptions(&options,argc,argv);
  filename = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::MidiFile(&midifile,filename);
  std::__cxx11::string::string((string *)&melody,"track-count",&local_99);
  bVar1 = smf::Options::getBoolean(&options,(string *)&melody);
  std::__cxx11::string::~string((string *)&melody);
  if (bVar1) {
    iVar2 = smf::MidiFile::getTrackCount(&midifile);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::__cxx11::string::string((string *)&melody,"track",&local_99);
    bVar1 = smf::Options::getBoolean(&options,(string *)&melody);
    std::__cxx11::string::~string((string *)&melody);
    if (!bVar1) {
      smf::MidiFile::joinTracks(&midifile);
    }
    melody.super__Vector_base<Melody,_std::allocator<Melody>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    melody.super__Vector_base<Melody,_std::allocator<Melody>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    melody.super__Vector_base<Melody,_std::allocator<Melody>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    convertToMelody(&midifile,&melody);
    sortMelody(&melody);
    iVar2 = smf::MidiFile::getTicksPerQuarterNote(&midifile);
    printMelody(&melody,iVar2);
    std::_Vector_base<Melody,_std::allocator<Melody>_>::~_Vector_base
              (&melody.super__Vector_base<Melody,_std::allocator<Melody>_>);
  }
  smf::MidiFile::~MidiFile(&midifile);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
   MidiFile midifile(options.getArg(1));
   if (options.getBoolean("track-count")) {
      cout << midifile.getTrackCount() << endl;
      return 0;
   }
   if (!options.getBoolean("track")) {
      midifile.joinTracks();
   } 

   vector<Melody> melody;
   convertToMelody(midifile, melody);
   sortMelody(melody);
   printMelody(melody, midifile.getTicksPerQuarterNote());

   return 0;
}